

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O0

void __thiscall
slang::analysis::DataFlowAnalysis::DataFlowAnalysis
          (DataFlowAnalysis *this,AnalysisContext *context,Symbol *symbol,bool reportDiags)

{
  AnalysisOptions AVar1;
  AnalysisManager *this_00;
  AnalysisOptions *pAVar2;
  undefined1 in_CL;
  AnalysisContext *in_RSI;
  DataFlowAnalysis *in_RDI;
  uint32_t unaff_retaddr;
  Diagnostics *this_01;
  undefined4 in_stack_ffffffffffffffd4;
  undefined3 in_stack_ffffffffffffffe4;
  uint uVar3;
  DataFlowAnalysis *pDVar4;
  
  uVar3 = CONCAT13(in_CL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  pDVar4 = in_RDI;
  this_00 = not_null<slang::analysis::AnalysisManager_*>::operator->
                      ((not_null<slang::analysis::AnalysisManager_*> *)0x807cd9);
  pAVar2 = AnalysisManager::getOptions(this_00);
  if ((uVar3 & 0x1000000) == 0) {
    this_01 = (Diagnostics *)0x0;
  }
  else {
    this_01 = &in_RSI->diagnostics;
  }
  AVar1.maxCaseAnalysisSteps = unaff_retaddr;
  AVar1._0_8_ = pDVar4;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::
  FlowAnalysisBase((AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                    *)CONCAT44(uVar3,pAVar2->maxCaseAnalysisSteps),*(Symbol **)pAVar2,AVar1,
                   (Diagnostics *)CONCAT44(in_stack_ffffffffffffffd4,pAVar2->maxCaseAnalysisSteps));
  in_RDI->context = in_RSI;
  PoolAllocator<char,_192UL,_64UL>::PoolAllocator(&in_RDI->bitMapAllocator,&in_RSI->alloc);
  PoolAllocator<char,_192UL,_64UL>::PoolAllocator(&in_RDI->lspMapAllocator,&in_RSI->alloc);
  SmallMap<const_slang::ast::ValueSymbol_*,_unsigned_int,_4UL,_std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
  ::SmallMap((SmallMap<const_slang::ast::ValueSymbol_*,_unsigned_int,_4UL,_std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
              *)this_01);
  SmallVector<slang::analysis::DataFlowAnalysis::LValueSymbol,_2UL>::SmallVector
            ((SmallVector<slang::analysis::DataFlowAnalysis::LValueSymbol,_2UL> *)0x807db0);
  SmallMap<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_4UL,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
  ::SmallMap((SmallMap<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_4UL,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
              *)this_01);
  LSPVisitor<slang::analysis::DataFlowAnalysis>::LSPVisitor(&in_RDI->lspVisitor,in_RDI);
  in_RDI->isLValue = false;
  SmallVector<const_slang::ast::Statement_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Statement_*,_5UL> *)0x807df6);
  SmallVector<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>,_2UL>::
  SmallVector((SmallVector<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>,_2UL>
               *)0x807e07);
  SmallVector<const_slang::ast::CallExpression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::CallExpression_*,_5UL> *)0x807e18);
  return;
}

Assistant:

DataFlowAnalysis::DataFlowAnalysis(AnalysisContext& context, const Symbol& symbol,
                                   bool reportDiags) :
    AbstractFlowAnalysis(symbol, context.manager->getOptions(),
                         reportDiags ? &context.diagnostics : nullptr),
    context(context), bitMapAllocator(context.alloc), lspMapAllocator(context.alloc),
    lspVisitor(*this) {
}